

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_rotri_i64_ppc64(TCGContext_conflict10 *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,uint arg2)

{
  if (arg2 != 0) {
    tcg_gen_rotli_i64_ppc64(tcg_ctx,ret,arg1,0x40 - arg2);
    return;
  }
  tcg_gen_mov_i64_ppc64(tcg_ctx,ret,arg1);
  return;
}

Assistant:

void tcg_gen_rotri_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, unsigned arg2)
{
    tcg_debug_assert(arg2 < 64);
    /* some cases can be optimized here */
    if (arg2 == 0) {
        tcg_gen_mov_i64(tcg_ctx, ret, arg1);
    } else {
        tcg_gen_rotli_i64(tcg_ctx, ret, arg1, 64 - arg2);
    }
}